

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu541.c
# Opt level: O0

MPP_RET hal_h264e_vepu541_ret_task(void *hal,HalEncTask *task)

{
  EncRcTask *pEVar1;
  uint uVar2;
  uint local_3c;
  uint local_38;
  RK_U32 mbs;
  RK_U32 mb_h;
  RK_U32 mb_w;
  EncRcTaskInfo *rc_info;
  HalH264eVepu541Ctx *ctx;
  HalEncTask *task_local;
  void *hal_local;
  
  pEVar1 = task->rc_task;
  uVar2 = *(int *)(*(long *)((long)hal + 0x38) + 0x3c) *
          *(int *)(*(long *)((long)hal + 0x38) + 0x40);
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","enter %p\n","hal_h264e_vepu541_ret_task",hal);
  }
  task->length = task->hw_length + task->length;
  (pEVar1->info).bit_real = task->hw_length << 3;
  (pEVar1->info).quality_real = (*(uint *)((long)hal + 0x818) & 0x3fffff) / uVar2;
  if (*(int *)((long)hal + 0x940) == 0) {
    local_38 = 0;
  }
  else {
    local_38 = *(uint *)((long)hal + 0x93c) / *(uint *)((long)hal + 0x940);
  }
  (pEVar1->info).madi = local_38;
  if (*(int *)((long)hal + 0x938) == 0) {
    local_3c = 0;
  }
  else {
    local_3c = *(uint *)((long)hal + 0x934) / *(uint *)((long)hal + 0x938);
  }
  (pEVar1->info).madp = local_3c;
  (pEVar1->info).iblk4_prop =
       (uint)((*(int *)((long)hal + 0x860) + *(int *)((long)hal + 0x85c) +
              *(int *)((long)hal + 0x858)) * 0x100) / uVar2;
  (pEVar1->info).sse =
       CONCAT44(*(uint *)((long)hal + 0x818) >> 0x18,*(undefined4 *)((long)hal + 0x814));
  (pEVar1->info).lvl16_inter_num = *(RK_U32 *)((long)hal + 0x84c);
  (pEVar1->info).lvl8_inter_num = *(RK_U32 *)((long)hal + 0x850);
  (pEVar1->info).lvl16_intra_num = *(RK_U32 *)((long)hal + 0x858);
  (pEVar1->info).lvl8_intra_num = *(RK_U32 *)((long)hal + 0x85c);
  (pEVar1->info).lvl4_intra_num = *(RK_U32 *)((long)hal + 0x860);
  *(RK_S32 *)((long)hal + 0xf0) = (pEVar1->info).bit_real;
  *(RK_S32 *)((long)hal + 0xf4) = (pEVar1->info).quality_real;
  *(RK_U32 *)((long)hal + 0x100) = (pEVar1->info).iblk4_prop;
  (task->hal_ret).data = (void *)((long)hal + 0xd0);
  (task->hal_ret).number = 1;
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","leave %p\n","hal_h264e_vepu541_ret_task",hal);
  }
  return MPP_OK;
}

Assistant:

static MPP_RET hal_h264e_vepu541_ret_task(void *hal, HalEncTask *task)
{
    HalH264eVepu541Ctx *ctx = (HalH264eVepu541Ctx *)hal;
    EncRcTaskInfo *rc_info = &task->rc_task->info;
    RK_U32 mb_w = ctx->sps->pic_width_in_mbs;
    RK_U32 mb_h = ctx->sps->pic_height_in_mbs;
    RK_U32 mbs = mb_w * mb_h;

    hal_h264e_dbg_func("enter %p\n", hal);

    // update total hardware length
    task->length += task->hw_length;

    // setup bit length for rate control
    rc_info->bit_real = task->hw_length * 8;
    rc_info->quality_real = ctx->regs_ret.st_sse_qp.qp_sum / mbs;
    rc_info->madi = (!ctx->regs_ret.st_mb_num) ? 0 :
                    ctx->regs_ret.st_madi /  ctx->regs_ret.st_mb_num;
    rc_info->madp = (!ctx->regs_ret.st_ctu_num) ? 0 :
                    ctx->regs_ret.st_madp / ctx->regs_ret.st_ctu_num;
    rc_info->iblk4_prop = (ctx->regs_ret.st_lvl4_intra_num +
                           ctx->regs_ret.st_lvl8_intra_num +
                           ctx->regs_ret.st_lvl16_intra_num) * 256 / mbs;

    rc_info->sse = ((RK_S64)(ctx->regs_ret.st_sse_qp.sse_h8 & 0xff) << 32) +
                   ctx->regs_ret.st_sse_l32.sse_l32;
    rc_info->lvl16_inter_num = ctx->regs_ret.st_lvl16_inter_num;
    rc_info->lvl8_inter_num  = ctx->regs_ret.st_lvl8_inter_num;
    rc_info->lvl16_intra_num = ctx->regs_ret.st_lvl16_intra_num;
    rc_info->lvl8_intra_num  = ctx->regs_ret.st_lvl8_intra_num;
    rc_info->lvl4_intra_num  = ctx->regs_ret.st_lvl4_intra_num;

    ctx->hal_rc_cfg.bit_real = rc_info->bit_real;
    ctx->hal_rc_cfg.quality_real = rc_info->quality_real;
    ctx->hal_rc_cfg.iblk4_prop = rc_info->iblk4_prop;

    task->hal_ret.data   = &ctx->hal_rc_cfg;
    task->hal_ret.number = 1;

    hal_h264e_dbg_func("leave %p\n", hal);

    return MPP_OK;
}